

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O0

void __thiscall crnlib::sparse_bit_array::clear_all_bits(sparse_bit_array *this)

{
  void *__s;
  uint *in_RDI;
  uint32 *pGroup;
  uint i;
  uint local_c;
  
  for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    __s = *(void **)(*(long *)(in_RDI + 2) + (ulong)local_c * 8);
    if (__s != (void *)0x0) {
      memset(__s,0,0x40);
    }
  }
  return;
}

Assistant:

void sparse_bit_array::clear_all_bits() {
  for (uint i = 0; i < m_num_groups; i++) {
    uint32* pGroup = m_ppGroups[i];
    if (pGroup)
      memset(pGroup, 0, sizeof(uint32) * cDWORDsPerGroup);
  }
}